

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O2

GenValidUsageXrHandleInfo * __thiscall
HandleInfoBase<XrEyeTrackerFB_T_*,_GenValidUsageXrHandleInfo>::get
          (HandleInfoBase<XrEyeTrackerFB_T_*,_GenValidUsageXrHandleInfo> *this,
          XrEyeTrackerFB_T *handle)

{
  GenValidUsageXrHandleInfo *pGVar1;
  iterator iVar2;
  UniqueLock lock;
  allocator local_41;
  unique_lock<std::mutex> local_40;
  XrEyeTrackerFB_T *local_30;
  string local_28;
  
  local_30 = handle;
  if (handle == (XrEyeTrackerFB_T *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_28,"Null handle passed to HandleInfoBase::get()",
               (allocator *)&local_40);
    reportInternalError(&local_28);
  }
  std::unique_lock<std::mutex>::unique_lock(&local_40,&this->dispatch_mutex_);
  iVar2 = std::
          _Hashtable<XrEyeTrackerFB_T_*,_std::pair<XrEyeTrackerFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrEyeTrackerFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrEyeTrackerFB_T_*>,_std::hash<XrEyeTrackerFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<XrEyeTrackerFB_T_*,_std::pair<XrEyeTrackerFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrEyeTrackerFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrEyeTrackerFB_T_*>,_std::hash<XrEyeTrackerFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_30);
  if (iVar2.
      super__Node_iterator_base<std::pair<XrEyeTrackerFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    pGVar1 = *(GenValidUsageXrHandleInfo **)
              ((long)iVar2.
                     super__Node_iterator_base<std::pair<XrEyeTrackerFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
                     ._M_cur + 0x10);
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    return pGVar1;
  }
  std::__cxx11::string::string
            ((string *)&local_28,"Handle passed to HandleInfoBase::insert() not inserted",&local_41)
  ;
  reportInternalError(&local_28);
}

Assistant:

inline InfoType *HandleInfoBase<HandleType, InfoType>::get(HandleType handle) {
    if (handle == XR_NULL_HANDLE) {
        reportInternalError("Null handle passed to HandleInfoBase::get()");
    }
    // Try to find the handle in the appropriate map
    UniqueLock lock(dispatch_mutex_);
    auto entry_returned = info_map_.find(handle);
    if (entry_returned == info_map_.end()) {
        reportInternalError("Handle passed to HandleInfoBase::insert() not inserted");
    }
    return entry_returned->second.get();
}